

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmWin.c
# Opt level: O2

void Sfm_NtkDfs_rec(Sfm_Ntk_t *p,int iNode,Vec_Int_t *vNodes,Vec_Wec_t *vGroups,Vec_Int_t *vGroupMap
                   ,Vec_Int_t *vBoxesLeft)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  int k;
  Vec_Int_t *p_01;
  
  if ((iNode < p->nPis) || (iVar1 = Sfm_ObjIsTravIdCurrent(p,iNode), iVar1 != 0)) {
    return;
  }
  iVar1 = Vec_IntEntry(vGroupMap,iNode);
  if (iVar1 < 0) {
    Sfm_ObjSetTravIdCurrent(p,iNode);
    for (iVar1 = 0; iVar3 = Sfm_ObjFaninNum(p,iNode), p_01 = vNodes, iVar1 < iVar3;
        iVar1 = iVar1 + 1) {
      iVar3 = Sfm_ObjFanin(p,iNode,iVar1);
      Sfm_NtkDfs_rec(p,iVar3,vNodes,vGroups,vGroupMap,vBoxesLeft);
    }
  }
  else {
    uVar2 = Vec_IntEntry(vGroupMap,iNode);
    if ((int)uVar2 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    iNode = uVar2 >> 1;
    p_00 = Vec_WecEntry(vGroups,iNode);
    iVar1 = 0;
    while (iVar3 = p_00->nSize, iVar1 < iVar3) {
      iVar3 = Vec_IntEntry(p_00,iVar1);
      if ((iVar3 < p->nPis) || (iVar1 = iVar1 + 1, p->nObjs <= iVar3 + p->nPos)) {
        __assert_fail("Sfm_ObjIsNode(p, iNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmWin.c"
                      ,0x94,
                      "void Sfm_NtkDfs_rec(Sfm_Ntk_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
    }
    for (iVar1 = 0; iVar1 < iVar3; iVar1 = iVar1 + 1) {
      iVar3 = Vec_IntEntry(p_00,iVar1);
      Sfm_ObjSetTravIdCurrent(p,iVar3);
      iVar3 = p_00->nSize;
    }
    for (iVar1 = 0; iVar1 < iVar3; iVar1 = iVar1 + 1) {
      iVar3 = Vec_IntEntry(p_00,iVar1);
      for (k = 0; iVar4 = Sfm_ObjFaninNum(p,iVar3), k < iVar4; k = k + 1) {
        iVar4 = Sfm_ObjFanin(p,iVar3,k);
        Sfm_NtkDfs_rec(p,iVar4,vNodes,vGroups,vGroupMap,vBoxesLeft);
      }
      iVar3 = p_00->nSize;
    }
    for (iVar1 = 0; p_01 = vBoxesLeft, iVar1 < iVar3; iVar1 = iVar1 + 1) {
      iVar3 = Vec_IntEntry(p_00,iVar1);
      Vec_IntPush(vNodes,iVar3);
      iVar3 = p_00->nSize;
    }
  }
  Vec_IntPush(p_01,iNode);
  return;
}

Assistant:

void Sfm_NtkDfs_rec( Sfm_Ntk_t * p, int iNode, Vec_Int_t * vNodes, Vec_Wec_t * vGroups, Vec_Int_t * vGroupMap, Vec_Int_t * vBoxesLeft )
{
    int i, iFanin;
    if ( Sfm_ObjIsPi(p, iNode) )
        return;
    if ( Sfm_ObjIsTravIdCurrent(p, iNode) )
        return;
    if ( Vec_IntEntry(vGroupMap, iNode) >= 0 )
    {
        int k, iGroup = Abc_Lit2Var( Vec_IntEntry(vGroupMap, iNode) );
        Vec_Int_t * vGroup = Vec_WecEntry( vGroups, iGroup );
        Vec_IntForEachEntry( vGroup, iNode, i )
            assert( Sfm_ObjIsNode(p, iNode) );
        Vec_IntForEachEntry( vGroup, iNode, i )
            Sfm_ObjSetTravIdCurrent( p, iNode );
        Vec_IntForEachEntry( vGroup, iNode, i )
            Sfm_ObjForEachFanin( p, iNode, iFanin, k )
                Sfm_NtkDfs_rec( p, iFanin, vNodes, vGroups, vGroupMap, vBoxesLeft );
        Vec_IntForEachEntry( vGroup, iNode, i )
            Vec_IntPush( vNodes, iNode );
        Vec_IntPush( vBoxesLeft, iGroup );
    }
    else
    {
        Sfm_ObjSetTravIdCurrent(p, iNode);
        Sfm_ObjForEachFanin( p, iNode, iFanin, i )
            Sfm_NtkDfs_rec( p, iFanin, vNodes, vGroups, vGroupMap, vBoxesLeft );
        Vec_IntPush( vNodes, iNode );
    }
}